

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextHtmlExporter::emitTable(QTextHtmlExporter *this,QTextTable *table)

{
  int iVar1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  QLatin1StringView s_07;
  QLatin1StringView s_08;
  QLatin1StringView s_09;
  bool bVar2;
  int iVar3;
  int iVar4;
  VerticalAlignment VVar5;
  reference pvVar6;
  int *piVar7;
  QVarLengthArray<bool,_256LL> *in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  QLatin1StringView QVar9;
  QTextLength QVar10;
  VerticalAlignment valign;
  int col;
  int row;
  int headerRowCount;
  int i;
  int columns;
  QString styleString;
  QList<QTextLength> columnWidths;
  int rows;
  QTextCharFormat temp;
  QTextCharFormat oldDefaultCharFormat;
  QTextTableCellFormat cellFormat;
  QTextTableCell cell;
  QTextTableFormat format;
  QVarLengthArray<bool,_256LL> widthEmittedForColumn;
  undefined4 in_stack_fffffffffffff3a8;
  VerticalAlignment in_stack_fffffffffffff3ac;
  undefined4 in_stack_fffffffffffff3b8;
  undefined2 in_stack_fffffffffffff3bc;
  QChar in_stack_fffffffffffff3be;
  int in_stack_fffffffffffff3c0;
  int in_stack_fffffffffffff3c4;
  Iterator *in_stack_fffffffffffff3c8;
  QTextHtmlExporter *in_stack_fffffffffffff3d0;
  QLatin1StringView in_stack_fffffffffffff3d8;
  QLatin1StringView in_stack_fffffffffffff3e8;
  QFlagsStorage<Qt::AlignmentFlag> align;
  undefined1 in_stack_fffffffffffff3f8 [16];
  undefined1 in_stack_fffffffffffff408 [16];
  undefined1 auVar11 [12];
  QTextHtmlExporter *in_stack_fffffffffffff418;
  qsizetype in_stack_fffffffffffff428;
  int local_bac;
  int local_b94;
  int local_b7c;
  QChar local_b4c;
  undefined2 local_b4a;
  QLatin1StringView local_b48;
  undefined2 local_b1a;
  QLatin1StringView local_b18;
  QLatin1StringView local_b08;
  undefined2 local_ad2;
  QLatin1StringView local_ad0;
  QLatin1StringView local_ac0;
  undefined2 local_a8a;
  QLatin1StringView local_a88;
  QLatin1StringView local_a78;
  undefined2 local_a42;
  QLatin1StringView local_a40;
  QLatin1StringView local_a30;
  undefined2 local_9fa;
  QLatin1StringView local_9d8;
  undefined2 local_99a;
  QLatin1StringView local_978;
  undefined2 local_93a;
  QLatin1StringView local_918;
  undefined2 local_8da;
  QLatin1StringView local_8b8;
  QLatin1StringView local_880;
  undefined1 local_870 [24];
  QLatin1StringView local_858;
  QLatin1StringView local_7e8;
  undefined1 local_7d8 [24];
  QLatin1StringView local_7c0;
  QLatin1StringView local_750;
  undefined1 local_740 [24];
  QLatin1StringView local_728;
  QLatin1StringView local_6b8;
  undefined1 local_6a8 [24];
  QLatin1StringView local_690;
  undefined2 local_61a;
  undefined1 local_618 [24];
  QLatin1StringView local_600;
  undefined2 local_5c2;
  undefined1 local_5c0 [24];
  QLatin1StringView local_5a8;
  undefined2 local_56a;
  undefined1 local_568 [24];
  QLatin1StringView local_550;
  undefined2 local_512;
  undefined1 local_510 [24];
  QLatin1StringView local_4f8;
  QChar local_4ba;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  undefined1 local_4a0 [24];
  undefined1 local_488 [28];
  int local_46c;
  QTextLength local_468;
  undefined1 *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  int local_440;
  QChar local_43a;
  undefined1 local_438 [24];
  undefined1 local_420 [24];
  Type local_408;
  qreal local_400;
  undefined1 local_3f8 [632];
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 local_120 [280];
  long local_8;
  
  align.i = in_stack_fffffffffffff3f8._4_4_;
  auVar11 = in_stack_fffffffffffff408._4_12_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::format((QTextTable *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
  Qt::Literals::StringLiterals::operator____L1
            ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                              CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
             (size_t)in_RDI);
  QVar9.m_size._4_4_ = in_stack_fffffffffffff3c4;
  QVar9.m_size._0_4_ = in_stack_fffffffffffff3c0;
  QVar9.m_data = (char *)in_stack_fffffffffffff3c8;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),QVar9
                     );
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                     CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
  if (bVar2) {
    qVar8 = QTextFrameFormat::border((QTextFrameFormat *)0x7b961c);
    QString::number(qVar8,(char)local_3f8,0x67);
    emitAttribute(in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,
                  (QString *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
    QString::~QString((QString *)0x7b9659);
  }
  emitFrameStyle(in_stack_fffffffffffff418,auVar11._4_8_,auVar11._0_4_);
  QTextTableFormat::alignment((QTextTableFormat *)in_RDI);
  emitAlignment((QTextHtmlExporter *)in_stack_fffffffffffff3d8.m_data,(Alignment)align.i);
  QVar10 = QTextFrameFormat::width((QTextFrameFormat *)0x7b96a2);
  local_400 = QVar10.fixedValueOrPercentage;
  local_408 = QVar10.lengthType;
  emitTextLength((QTextHtmlExporter *)in_stack_fffffffffffff3d8.m_data,
                 (char *)in_stack_fffffffffffff3d8.m_size,(QTextLength *)in_stack_fffffffffffff3d0);
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                     CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
  if (bVar2) {
    qVar8 = QTextTableFormat::cellSpacing((QTextTableFormat *)0x7b96f0);
    QString::number(qVar8,(char)local_420,0x67);
    emitAttribute(in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,
                  (QString *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
    QString::~QString((QString *)0x7b972d);
  }
  bVar2 = QTextFormat::hasProperty
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                     CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
  if (bVar2) {
    qVar8 = QTextTableFormat::cellPadding((QTextTableFormat *)0x7b9752);
    QString::number(qVar8,(char)local_438,0x67);
    emitAttribute(in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,
                  (QString *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
    QString::~QString((QString *)0x7b978f);
  }
  emitBackgroundAttribute
            ((QTextHtmlExporter *)in_stack_fffffffffffff3e8.m_size,
             (QTextFormat *)in_stack_fffffffffffff3d8.m_data);
  QChar::QChar<char16_t,_true>(&local_43a,L'>');
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffff3be);
  local_440 = QTextTable::rows((QTextTable *)in_RDI);
  iVar3 = QTextTable::columns((QTextTable *)in_RDI);
  local_458 = &DAT_aaaaaaaaaaaaaaaa;
  local_450 = &DAT_aaaaaaaaaaaaaaaa;
  local_448 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTableFormat::columnWidthConstraints
            ((QTextTableFormat *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  bVar2 = QList<QTextLength>::isEmpty((QList<QTextLength> *)0x7b983c);
  if (bVar2) {
    QList<QTextLength>::resize
              ((QList<QTextLength> *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
               CONCAT26(in_stack_fffffffffffff3be.ucs,
                        CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)));
    QTextLength::QTextLength(&local_468);
    QList<QTextLength>::fill
              ((QList<QTextLength> *)in_stack_fffffffffffff3e8.m_data,
               (parameter_type)in_stack_fffffffffffff3e8.m_size,in_stack_fffffffffffff428);
  }
  memset(local_120,0xaa,0x118);
  QVarLengthArray<bool,_256LL>::QVarLengthArray
            (in_RDI,CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
  for (local_b7c = 0; local_b7c < iVar3; local_b7c = local_b7c + 1) {
    pvVar6 = QVLABase<bool>::operator[]
                       ((QVLABase<bool> *)
                        CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),0x7b98dc);
    *pvVar6 = false;
  }
  local_46c = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7b98ff);
  piVar7 = qMin<int>(&local_46c,&local_440);
  iVar1 = *piVar7;
  if (0 < iVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
               (size_t)in_RDI);
    s.m_size._4_4_ = in_stack_fffffffffffff3c4;
    s.m_size._0_4_ = in_stack_fffffffffffff3c0;
    s.m_data = (char *)in_stack_fffffffffffff3c8;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),s);
  }
  for (local_b94 = 0; local_b94 < local_440; local_b94 = local_b94 + 1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
               (size_t)in_RDI);
    s_00.m_size._4_4_ = in_stack_fffffffffffff3c4;
    s_00.m_size._0_4_ = in_stack_fffffffffffff3c0;
    s_00.m_data = (char *)in_stack_fffffffffffff3c8;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),
                        s_00);
    for (local_bac = 0; local_bac < iVar3; local_bac = local_bac + 1) {
      local_140._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_140._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c4,
                         in_stack_fffffffffffff3c0);
      iVar4 = QTextTableCell::row((QTextTableCell *)
                                  CONCAT26(in_stack_fffffffffffff3be.ucs,
                                           CONCAT24(in_stack_fffffffffffff3bc,
                                                    in_stack_fffffffffffff3b8)));
      if ((iVar4 == local_b94) &&
         (iVar4 = QTextTableCell::column
                            ((QTextTableCell *)
                             CONCAT26(in_stack_fffffffffffff3be.ucs,
                                      CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
                            ), iVar4 == local_bac)) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                    CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                   (size_t)in_RDI);
        s_01.m_size._4_4_ = in_stack_fffffffffffff3c4;
        s_01.m_size._0_4_ = in_stack_fffffffffffff3c0;
        s_01.m_data = (char *)in_stack_fffffffffffff3c8;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                            ,s_01);
        pvVar6 = QVLABase<bool>::operator[]
                           ((QVLABase<bool> *)
                            CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),0x7b9abf);
        if (((*pvVar6 & 1U) == 0) &&
           (iVar4 = QTextTableCell::columnSpan
                              ((QTextTableCell *)
                               CONCAT26(in_stack_fffffffffffff3be.ucs,
                                        CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8
                                                ))), iVar4 == 1)) {
          QList<QTextLength>::at
                    ((QList<QTextLength> *)in_RDI,
                     CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          emitTextLength((QTextHtmlExporter *)in_stack_fffffffffffff3d8.m_data,
                         (char *)in_stack_fffffffffffff3d8.m_size,
                         (QTextLength *)in_stack_fffffffffffff3d0);
          pvVar6 = QVLABase<bool>::operator[]
                             ((QVLABase<bool> *)
                              CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),0x7b9b14
                             );
          *pvVar6 = true;
        }
        iVar4 = QTextTableCell::columnSpan
                          ((QTextTableCell *)
                           CONCAT26(in_stack_fffffffffffff3be.ucs,
                                    CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)));
        if (1 < iVar4) {
          iVar4 = QTextTableCell::columnSpan
                            ((QTextTableCell *)
                             CONCAT26(in_stack_fffffffffffff3be.ucs,
                                      CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
                            );
          QString::number((int)local_488,iVar4);
          emitAttribute(in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,
                        (QString *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
          QString::~QString((QString *)0x7b9b70);
        }
        iVar4 = QTextTableCell::rowSpan
                          ((QTextTableCell *)
                           CONCAT26(in_stack_fffffffffffff3be.ucs,
                                    CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)));
        if (1 < iVar4) {
          iVar4 = QTextTableCell::rowSpan
                            ((QTextTableCell *)
                             CONCAT26(in_stack_fffffffffffff3be.ucs,
                                      CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
                            );
          QString::number((int)local_4a0,iVar4);
          emitAttribute(in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,
                        (QString *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0));
          QString::~QString((QString *)0x7b9bc9);
        }
        local_150 = &DAT_aaaaaaaaaaaaaaaa;
        local_148 = &DAT_aaaaaaaaaaaaaaaa;
        QTextTableCell::format((QTextTableCell *)in_stack_fffffffffffff3d8.m_size);
        QTextFormat::toTableCellFormat
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b9c1e);
        emitBackgroundAttribute
                  ((QTextHtmlExporter *)in_stack_fffffffffffff3e8.m_size,
                   (QTextFormat *)in_stack_fffffffffffff3d8.m_data);
        local_170 = &DAT_aaaaaaaaaaaaaaaa;
        local_168 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::QTextCharFormat
                  ((QTextCharFormat *)in_RDI,
                   (QTextCharFormat *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8))
        ;
        VVar5 = QTextCharFormat::verticalAlignment((QTextCharFormat *)0x7b9c71);
        local_4b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_4b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_4a8 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x7b9cb2);
        if ((2 < (int)VVar5) && ((int)VVar5 < 6)) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                      CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
                     ,(size_t)in_RDI);
          s_02.m_size._4_4_ = in_stack_fffffffffffff3c4;
          s_02.m_size._0_4_ = in_stack_fffffffffffff3c0;
          s_02.m_data = (char *)in_stack_fffffffffffff3c8;
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),s_02);
          if (VVar5 == AlignMiddle) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                        CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8
                                                )),(size_t)in_RDI);
            s_03.m_size._4_4_ = in_stack_fffffffffffff3c4;
            s_03.m_size._0_4_ = in_stack_fffffffffffff3c0;
            s_03.m_data = (char *)in_stack_fffffffffffff3c8;
            QString::operator+=((QString *)CONCAT44(VVar5,in_stack_fffffffffffff3a8),s_03);
          }
          else if (VVar5 == AlignTop) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                        CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8
                                                )),(size_t)in_RDI);
            s_04.m_size._4_4_ = in_stack_fffffffffffff3c4;
            s_04.m_size._0_4_ = in_stack_fffffffffffff3c0;
            s_04.m_data = (char *)in_stack_fffffffffffff3c8;
            QString::operator+=((QString *)CONCAT44(VVar5,in_stack_fffffffffffff3a8),s_04);
          }
          else if (VVar5 == AlignBottom) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                        CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8
                                                )),(size_t)in_RDI);
            s_05.m_size._4_4_ = in_stack_fffffffffffff3c4;
            s_05.m_size._0_4_ = in_stack_fffffffffffff3c0;
            s_05.m_data = (char *)in_stack_fffffffffffff3c8;
            QString::operator+=((QString *)CONCAT44(VVar5,in_stack_fffffffffffff3a8),s_05);
          }
          QChar::QChar<char16_t,_true>(&local_4ba,L';');
          QString::operator+=((QString *)in_RDI,in_stack_fffffffffffff3be);
          local_180 = &DAT_aaaaaaaaaaaaaaaa;
          local_178 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7b9e27);
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT26(in_stack_fffffffffffff3be.ucs,
                              CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                     (VerticalAlignment)((ulong)in_RDI >> 0x20));
          QTextFormat::merge((QTextFormat *)in_stack_fffffffffffff3e8.m_data,
                             (QTextFormat *)in_stack_fffffffffffff3e8.m_size);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b9e5e);
          in_stack_fffffffffffff3ac = VVar5;
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_4f8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::leftPadding((QTextTableCellFormat *)0x7b9ea7);
          QString::number(qVar8,(char)local_510,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_512 = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7b9f24);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7b9f31);
          QString::~QString((QString *)0x7b9f3e);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_550 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::rightPadding((QTextTableCellFormat *)0x7b9f87);
          QString::number(qVar8,(char)local_568,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_56a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba004);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba011);
          QString::~QString((QString *)0x7ba01e);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_5a8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::topPadding((QTextTableCellFormat *)0x7ba067);
          QString::number(qVar8,(char)local_5c0,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_5c2 = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba0e4);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba0f1);
          QString::~QString((QString *)0x7ba0fe);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_600 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::bottomPadding((QTextTableCellFormat *)0x7ba147);
          QString::number(qVar8,(char)local_618,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_61a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba1c4);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba1d1);
          QString::~QString((QString *)0x7ba1de);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_690 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::topBorder((QTextTableCellFormat *)0x7ba227);
          QString::number(qVar8,(char)local_6a8,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_6b8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QLatin1String *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                     0x7ba2bb);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba2c8);
          QString::~QString((QString *)0x7ba2d5);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_728 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::rightBorder((QTextTableCellFormat *)0x7ba31e);
          QString::number(qVar8,(char)local_740,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_750 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QLatin1String *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                     0x7ba3b2);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba3bf);
          QString::~QString((QString *)0x7ba3cc);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_7c0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::bottomBorder((QTextTableCellFormat *)0x7ba415);
          QString::number(qVar8,(char)local_7d8,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_7e8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QLatin1String *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                     0x7ba4a9);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba4b6);
          QString::~QString((QString *)0x7ba4c3);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_858 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          qVar8 = QTextTableCellFormat::leftBorder((QTextTableCellFormat *)0x7ba50c);
          QString::number(qVar8,(char)local_870,0x67);
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_880 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QLatin1String *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> *)
                     0x7ba5a0);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba5ad);
          QString::~QString((QString *)0x7ba5ba);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_8b8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::topBorderBrush
                    ((QTextTableCellFormat *)
                     CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          QBrush::color((QBrush *)0x7ba618);
          QColor::name((QColor *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                       CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_8da = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba690);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba69d);
          QString::~QString((QString *)0x7ba6aa);
          QBrush::~QBrush((QBrush *)0x7ba6b7);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_918 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::rightBorderBrush
                    ((QTextTableCellFormat *)
                     CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          QBrush::color((QBrush *)0x7ba715);
          QColor::name((QColor *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                       CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_93a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba78d);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba79a);
          QString::~QString((QString *)0x7ba7a7);
          QBrush::~QBrush((QBrush *)0x7ba7b4);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_978 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::bottomBorderBrush
                    ((QTextTableCellFormat *)
                     CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          QBrush::color((QBrush *)0x7ba812);
          QColor::name((QColor *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                       CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_99a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba88a);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba897);
          QString::~QString((QString *)0x7ba8a4);
          QBrush::~QBrush((QBrush *)0x7ba8b1);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_9d8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::leftBorderBrush
                    ((QTextTableCellFormat *)
                     CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          QBrush::color((QBrush *)0x7ba90f);
          QColor::name((QColor *)CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                       CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
          ::operator+((QLatin1String *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (QString *)in_RDI);
          local_9fa = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QString> *)
                      CONCAT26(in_stack_fffffffffffff3be.ucs,
                               CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                      (char16_t *)in_RDI);
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x7ba987);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x7ba994);
          QString::~QString((QString *)0x7ba9a1);
          QBrush::~QBrush((QBrush *)0x7ba9ae);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_a30 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::topBorderStyle((QTextTableCellFormat *)0x7ba9f7);
          local_a40 = richtextBorderStyleToHtmlBorderStyle((BorderStyle)((ulong)in_RDI >> 0x20));
          ::operator+((QLatin1String *)in_RDI,
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                     );
          local_a42 = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)in_RDI,
                      (char16_t *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_a78 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::rightBorderStyle((QTextTableCellFormat *)0x7baab0);
          local_a88 = richtextBorderStyleToHtmlBorderStyle((BorderStyle)((ulong)in_RDI >> 0x20));
          ::operator+((QLatin1String *)in_RDI,
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                     );
          local_a8a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)in_RDI,
                      (char16_t *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_ac0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::bottomBorderStyle((QTextTableCellFormat *)0x7bab69);
          local_ad0 = richtextBorderStyleToHtmlBorderStyle((BorderStyle)((ulong)in_RDI >> 0x20));
          ::operator+((QLatin1String *)in_RDI,
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                     );
          local_ad2 = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)in_RDI,
                      (char16_t *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
        }
        bVar2 = QTextFormat::hasProperty
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                           CONCAT22(in_stack_fffffffffffff3be.ucs,in_stack_fffffffffffff3bc));
        if (bVar2) {
          local_b08 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          QTextTableCellFormat::leftBorderStyle((QTextTableCellFormat *)0x7bac22);
          local_b18 = richtextBorderStyleToHtmlBorderStyle((BorderStyle)((ulong)in_RDI >> 0x20));
          ::operator+((QLatin1String *)in_RDI,
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                     );
          local_b1a = 0x3b;
          ::operator+((QStringBuilder<QLatin1String,_QLatin1String> *)in_RDI,
                      (char16_t *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
        }
        bVar2 = QString::isEmpty((QString *)0x7bac9f);
        if (!bVar2) {
          local_b48 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff3bc,
                                                           in_stack_fffffffffffff3b8)),
                                 (size_t)in_RDI);
          ::operator+((QLatin1String *)in_RDI,
                      (QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          local_b4a = 0x22;
          ::operator+((QStringBuilder<QLatin1String,_QString_&> *)in_RDI,
                      (char16_t *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8));
          ::operator+=((QString *)in_stack_fffffffffffff3d8.m_data,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t> *)
                       in_stack_fffffffffffff3d8.m_size);
        }
        QChar::QChar<char16_t,_true>(&local_b4c,L'>');
        QString::operator+=((QString *)in_RDI,in_stack_fffffffffffff3be);
        QTextTableCell::begin((QTextTableCell *)in_stack_fffffffffffff3d8.m_data);
        emitFrame(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
        in_stack_fffffffffffff3e8 =
             Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                         CONCAT24(in_stack_fffffffffffff3bc,
                                                  in_stack_fffffffffffff3b8)),(size_t)in_RDI);
        s_06.m_size._4_4_ = in_stack_fffffffffffff3c4;
        s_06.m_size._0_4_ = in_stack_fffffffffffff3c0;
        s_06.m_data = (char *)in_stack_fffffffffffff3c8;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8)
                            ,s_06);
        QTextCharFormat::operator=
                  ((QTextCharFormat *)in_RDI,
                   (QTextCharFormat *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8))
        ;
        QString::~QString((QString *)0x7badb7);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7badc4);
        QTextTableCellFormat::~QTextTableCellFormat((QTextTableCellFormat *)0x7badd1);
      }
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_140);
    }
    in_stack_fffffffffffff3d8 =
         Qt::Literals::StringLiterals::operator____L1
                   ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                     CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8)),
                    (size_t)in_RDI);
    s_07.m_size._4_4_ = in_stack_fffffffffffff3c4;
    s_07.m_size._0_4_ = in_stack_fffffffffffff3c0;
    s_07.m_data = (char *)in_stack_fffffffffffff3c8;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),
                        s_07);
    if ((0 < iVar1) && (local_b94 == iVar1 + -1)) {
      QVar9 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                          CONCAT24(in_stack_fffffffffffff3bc,
                                                   in_stack_fffffffffffff3b8)),(size_t)in_RDI);
      in_stack_fffffffffffff3c8 = (Iterator *)QVar9.m_size;
      in_stack_fffffffffffff3d0 = (QTextHtmlExporter *)QVar9.m_data;
      s_08.m_size._4_4_ = in_stack_fffffffffffff3c4;
      s_08.m_size._0_4_ = in_stack_fffffffffffff3c0;
      s_08.m_data = (char *)in_stack_fffffffffffff3c8;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),
                          s_08);
    }
  }
  QVar9 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT26(in_stack_fffffffffffff3be.ucs,
                                      CONCAT24(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
                     ,(size_t)in_RDI);
  s_09.m_data = (char *)in_stack_fffffffffffff3c8;
  s_09.m_size = (qsizetype)QVar9.m_data;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),s_09)
  ;
  QVarLengthArray<bool,_256LL>::~QVarLengthArray(in_RDI);
  QList<QTextLength>::~QList((QList<QTextLength> *)0x7baeee);
  QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7baefb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitTable(const QTextTable *table)
{
    QTextTableFormat format = table->format();

    html += "\n<table"_L1;

    if (format.hasProperty(QTextFormat::FrameBorder))
        emitAttribute("border", QString::number(format.border()));

    emitFrameStyle(format, TableFrame);

    emitAlignment(format.alignment());
    emitTextLength("width", format.width());

    if (format.hasProperty(QTextFormat::TableCellSpacing))
        emitAttribute("cellspacing", QString::number(format.cellSpacing()));
    if (format.hasProperty(QTextFormat::TableCellPadding))
        emitAttribute("cellpadding", QString::number(format.cellPadding()));

    emitBackgroundAttribute(format);

    html += u'>';

    const int rows = table->rows();
    const int columns = table->columns();

    QList<QTextLength> columnWidths = format.columnWidthConstraints();
    if (columnWidths.isEmpty()) {
        columnWidths.resize(columns);
        columnWidths.fill(QTextLength());
    }
    Q_ASSERT(columnWidths.size() == columns);

    QVarLengthArray<bool> widthEmittedForColumn(columns);
    for (int i = 0; i < columns; ++i)
        widthEmittedForColumn[i] = false;

    const int headerRowCount = qMin(format.headerRowCount(), rows);
    if (headerRowCount > 0)
        html += "<thead>"_L1;

    for (int row = 0; row < rows; ++row) {
        html += "\n<tr>"_L1;

        for (int col = 0; col < columns; ++col) {
            const QTextTableCell cell = table->cellAt(row, col);

            // for col/rowspans
            if (cell.row() != row)
                continue;

            if (cell.column() != col)
                continue;

            html += "\n<td"_L1;

            if (!widthEmittedForColumn[col] && cell.columnSpan() == 1) {
                emitTextLength("width", columnWidths.at(col));
                widthEmittedForColumn[col] = true;
            }

            if (cell.columnSpan() > 1)
                emitAttribute("colspan", QString::number(cell.columnSpan()));

            if (cell.rowSpan() > 1)
                emitAttribute("rowspan", QString::number(cell.rowSpan()));

            const QTextTableCellFormat cellFormat = cell.format().toTableCellFormat();
            emitBackgroundAttribute(cellFormat);

            QTextCharFormat oldDefaultCharFormat = defaultCharFormat;

            QTextCharFormat::VerticalAlignment valign = cellFormat.verticalAlignment();

            QString styleString;
            if (valign >= QTextCharFormat::AlignMiddle && valign <= QTextCharFormat::AlignBottom) {
                styleString += " vertical-align:"_L1;
                switch (valign) {
                case QTextCharFormat::AlignMiddle:
                    styleString += "middle"_L1;
                    break;
                case QTextCharFormat::AlignTop:
                    styleString += "top"_L1;
                    break;
                case QTextCharFormat::AlignBottom:
                    styleString += "bottom"_L1;
                    break;
                default:
                    break;
                }
                styleString += u';';

                QTextCharFormat temp;
                temp.setVerticalAlignment(valign);
                defaultCharFormat.merge(temp);
            }

            if (cellFormat.hasProperty(QTextFormat::TableCellLeftPadding))
                styleString += " padding-left:"_L1 + QString::number(cellFormat.leftPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightPadding))
                styleString += " padding-right:"_L1 + QString::number(cellFormat.rightPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellTopPadding))
                styleString += " padding-top:"_L1 + QString::number(cellFormat.topPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomPadding))
                styleString += " padding-bottom:"_L1 + QString::number(cellFormat.bottomPadding()) + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorder))
                styleString += " border-top:"_L1 + QString::number(cellFormat.topBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorder))
                styleString += " border-right:"_L1 + QString::number(cellFormat.rightBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorder))
                styleString += " border-bottom:"_L1 + QString::number(cellFormat.bottomBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorder))
                styleString += " border-left:"_L1 + QString::number(cellFormat.leftBorder()) + "px;"_L1;

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderBrush))
                styleString += " border-top-color:"_L1 + cellFormat.topBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderBrush))
                styleString += " border-right-color:"_L1 + cellFormat.rightBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderBrush))
                styleString += " border-bottom-color:"_L1 + cellFormat.bottomBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderBrush))
                styleString += " border-left-color:"_L1 + cellFormat.leftBorderBrush().color().name() + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderStyle))
                styleString += " border-top-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.topBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderStyle))
                styleString += " border-right-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.rightBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderStyle))
                styleString += " border-bottom-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.bottomBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderStyle))
                styleString += " border-left-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.leftBorderStyle()) + u';';

            if (!styleString.isEmpty())
                html += " style=\""_L1 + styleString + u'\"';

            html += u'>';

            emitFrame(cell.begin());

            html += "</td>"_L1;

            defaultCharFormat = oldDefaultCharFormat;
        }

        html += "</tr>"_L1;
        if (headerRowCount > 0 && row == headerRowCount - 1)
            html += "</thead>"_L1;
    }

    html += "</table>"_L1;
}